

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O1

void __thiscall
gl4cts::TextureViewTestCoherency::getReadPropertiesForTextureType
          (TextureViewTestCoherency *this,_texture_type texture_type,GLuint *out_to_id,
          uint *out_read_lod)

{
  long lVar1;
  TestError *this_00;
  
  lVar1 = 0xc0;
  if (texture_type != TEXTURE_TYPE_PARENT_TEXTURE) {
    if (texture_type != TEXTURE_TYPE_TEXTURE_VIEW) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized read source",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0x21e1);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    texture_type = TEXTURE_TYPE_IMAGE;
    lVar1 = 0xb8;
  }
  *out_to_id = *(GLuint *)
                ((long)&(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode + lVar1)
  ;
  *out_read_lod = texture_type;
  return;
}

Assistant:

void TextureViewTestCoherency::getReadPropertiesForTextureType(_texture_type texture_type, glw::GLuint* out_to_id,
															   unsigned int* out_read_lod) const
{
	switch (texture_type)
	{
	case TEXTURE_TYPE_PARENT_TEXTURE:
	{
		*out_to_id = m_view_to_id;

		/* We've modified LOD1 of parent texture which corresponds
		 * to LOD 0 from the view's PoV
		 */
		*out_read_lod = 0;

		break;
	}

	case TEXTURE_TYPE_TEXTURE_VIEW:
	{
		*out_to_id = m_to_id;

		/* We've modified LOD1 of the view texture which corresponds
		 * to LOD2 from parent texture's PoV.
		 */
		*out_read_lod = 2;

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized read source");
	}
	} /* switch (texture_type) */
}